

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::TimeLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  optional<slang::TimeScale> oVar1;
  Compilation *this;
  Type *args_2;
  TimeLiteral *pTVar2;
  long in_RSI;
  undefined8 in_RDI;
  SourceRange SVar3;
  Compilation *unaff_retaddr;
  Compilation *comp;
  TimeScale scale;
  TimeUnit unit;
  double value;
  Token *in_stack_ffffffffffffffb0;
  optional<slang::TimeScale> *in_stack_ffffffffffffffb8;
  TimeScale *this_00;
  undefined1 in_stack_ffffffffffffffc0 [16];
  undefined1 local_27 [4];
  _Storage<slang::TimeScale,_true> local_23;
  undefined1 local_1f;
  TimeScale local_1e;
  NumericTokenFlags local_1a;
  TimeUnit local_19;
  double local_18;
  long local_10;
  SyntaxKind typeKind;
  
  typeKind = (SyntaxKind)((ulong)in_RDI >> 0x20);
  local_10 = in_RSI;
  local_18 = parsing::Token::realValue(in_stack_ffffffffffffffb0);
  local_1a = parsing::Token::numericFlags((Token *)(local_10 + 0x18));
  local_19 = parsing::NumericTokenFlags::unit(&local_1a);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x992a2e);
  this_00 = in_stack_ffffffffffffffc0._0_8_;
  oVar1 = Scope::getTimeScale(in_stack_ffffffffffffffc0._8_8_);
  local_23 = oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_1f = oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_engaged;
  memset(local_27,0,4);
  TimeScale::TimeScale((TimeScale *)in_stack_ffffffffffffffb0);
  local_1e = std::optional<slang::TimeScale>::value_or<slang::TimeScale>
                       (in_stack_ffffffffffffffb8,(TimeScale *)in_stack_ffffffffffffffb0);
  local_18 = TimeScale::apply(this_00,(double)in_stack_ffffffffffffffb8,
                              (TimeUnit)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
                              SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x30,0));
  this = ASTContext::getCompilation((ASTContext *)0x992a99);
  args_2 = Compilation::getType(unaff_retaddr,typeKind);
  SVar3 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)unaff_retaddr);
  pTVar2 = BumpAllocator::
           emplace<slang::ast::TimeLiteral,slang::ast::Type_const&,double&,slang::SourceRange>
                     (&this->super_BumpAllocator,(Type *)SVar3.endLoc,(double *)SVar3.startLoc,
                      (SourceRange *)args_2);
  return &pTVar2->super_Expression;
}

Assistant:

Expression& TimeLiteral::fromSyntax(const ASTContext& context,
                                    const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::TimeLiteralExpression);

    // The provided value needs to be scaled to the current scope's time units
    // and then rounded to the current scope's time precision.
    double value = syntax.literal.realValue();
    TimeUnit unit = syntax.literal.numericFlags().unit();
    TimeScale scale = context.scope->getTimeScale().value_or(TimeScale());
    value = scale.apply(value, unit, /* roundToPrecision */ false);

    auto& comp = context.getCompilation();
    return *comp.emplace<TimeLiteral>(comp.getType(SyntaxKind::RealTimeType), value,
                                      syntax.sourceRange());
}